

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O0

void __thiscall
cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this,VariableIndex *from_where)

{
  Dim *pDVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  float *pfVar9;
  const_reference ppNVar10;
  reference t_;
  reference ppTVar11;
  reference pVVar12;
  VariableIndex *in_RSI;
  void *__ptr;
  Tensor *in_RDI;
  float **this_00;
  reference rVar13;
  VariableIndex i_3;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range1_1;
  VariableIndex arg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range2_2;
  VariableIndex arg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range2_1;
  uint ai;
  Node *node;
  int i_2;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  vector<bool,_std::allocator<bool>_> in_computation;
  VariableIndex arg;
  iterator __end2;
  iterator __begin2;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range2;
  bool nd;
  uint ni;
  VariableIndex i_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *__range1;
  vector<bool,_std::allocator<bool>_> needs_derivative;
  Dim dim;
  uint i;
  uint num_nodes;
  value_type in_stack_fffffffffffffc48;
  Dim *in_stack_fffffffffffffc50;
  allocator_type *in_stack_fffffffffffffc58;
  AlignedMemoryPool<6U> *in_stack_fffffffffffffc60;
  size_type in_stack_fffffffffffffc68;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *this_01;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc70;
  Tensor *in_stack_fffffffffffffdf8;
  Tensor *in_stack_fffffffffffffe00;
  __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  in_stack_fffffffffffffe08;
  Node *in_stack_fffffffffffffe10;
  reference local_1e8;
  VariableIndex local_1d4;
  VariableIndex *local_1d0;
  __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_1c8;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_1c0;
  reference local_1b8;
  VariableIndex local_1a4;
  VariableIndex *local_1a0;
  __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_198;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_190;
  uint local_184;
  value_type local_180;
  reference local_178;
  uint local_164;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> local_160;
  reference local_148;
  undefined1 local_131;
  reference local_108;
  reference local_f8;
  VariableIndex local_e4;
  VariableIndex *local_e0;
  __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_d8;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *local_d0;
  reference local_c8;
  byte local_b5;
  uint local_b4;
  reference local_b0;
  VariableIndex local_9c;
  VariableIndex *local_98;
  __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
  local_90;
  long local_88;
  undefined1 local_69;
  undefined1 local_3c [36];
  uint local_18;
  uint local_14;
  
  puVar5 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  uVar6 = (ulong)(*puVar5 + 1);
  sVar7 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                    ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)((in_RDI->d).d + 4));
  if (sVar7 < uVar6) {
    __assert_fail("from_where+1 <= nfxs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x56,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  puVar5 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  uVar4 = *puVar5;
  sVar7 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                    (*(vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> **)((in_RDI->d).d + 2));
  if (sVar7 < uVar4 + 1) {
    __assert_fail("from_where+1 <= cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x57,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  pDVar1 = &in_RDI->d;
  puVar5 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(pDVar1->d + 4),(ulong)*puVar5);
  uVar4 = Dim::size(in_stack_fffffffffffffc50);
  if (uVar4 != 1) {
    std::operator<<((ostream *)&std::cerr,"backward() called on non-scalar node.\n");
    abort();
  }
  puVar5 = VariableIndex::operator_cast_to_unsigned_int_(in_RSI);
  local_14 = *puVar5 + 1;
  __ptr = (void *)(ulong)local_14;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize
            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc68);
  AlignedMemoryPool<6U>::free(dEdfs,__ptr);
  local_18 = 0;
  while( true ) {
    if (local_14 <= local_18) {
      AlignedMemoryPool<6U>::zero_allocated_memory
                ((AlignedMemoryPool<6U> *)in_stack_fffffffffffffc50);
      pfVar9 = kSCALAR_ONE;
      pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::back
                         ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                          in_stack_fffffffffffffc50);
      pvVar8->v = pfVar9;
      local_69 = 0;
      std::allocator<bool>::allocator((allocator<bool> *)0x34ae05);
      std::vector<bool,_std::allocator<bool>_>::vector
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                 (bool *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      std::allocator<bool>::~allocator((allocator<bool> *)0x34ae39);
      local_88 = *(long *)((in_RDI->d).d + 2) + 0x18;
      local_90._M_current =
           (VariableIndex *)
           std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                     ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                      in_stack_fffffffffffffc48);
      local_98 = (VariableIndex *)
                 std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                           ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                            in_stack_fffffffffffffc48);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                            *)in_stack_fffffffffffffc50,
                           (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                            *)in_stack_fffffffffffffc48);
        if (!bVar3) break;
        pVVar12 = __gnu_cxx::
                  __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                  ::operator*(&local_90);
        VariableIndex::VariableIndex(&local_9c,pVVar12);
        VariableIndex::operator_cast_to_unsigned_int_(&local_9c);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        local_b0 = rVar13;
        std::_Bit_reference::operator=(&local_b0,true);
        __gnu_cxx::
        __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
        ::operator++(&local_90);
      }
      for (local_b4 = 0; local_b4 < local_14; local_b4 = local_b4 + 1) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        local_c8 = rVar13;
        local_b5 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
        ppNVar10 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                             (*(vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> **)
                               ((in_RDI->d).d + 2),(ulong)local_b4);
        local_d0 = &(*ppNVar10)->args;
        local_d8._M_current =
             (VariableIndex *)
             std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                       ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                        in_stack_fffffffffffffc48);
        local_e0 = (VariableIndex *)
                   std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                             ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                              in_stack_fffffffffffffc48);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                              *)in_stack_fffffffffffffc50,
                             (__normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                              *)in_stack_fffffffffffffc48);
          bVar2 = local_b5;
          if (!bVar3) break;
          t_ = __gnu_cxx::
               __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
               ::operator*(&local_d8);
          VariableIndex::VariableIndex(&local_e4,t_);
          VariableIndex::operator_cast_to_unsigned_int_(&local_e4);
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          local_f8 = rVar13;
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_f8);
          local_b5 = (local_b5 & 1) != 0 || bVar3;
          __gnu_cxx::
          __normal_iterator<cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
          ::operator++(&local_d8);
        }
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        local_108 = rVar13;
        std::_Bit_reference::operator=(&local_108,(bool)(bVar2 & 1));
      }
      local_131 = 0;
      std::allocator<bool>::allocator((allocator<bool> *)0x34b1ee);
      std::vector<bool,_std::allocator<bool>_>::vector
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                 (bool *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      std::allocator<bool>::~allocator((allocator<bool> *)0x34b222);
      local_148 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      std::_Bit_reference::operator=(&local_148,true);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::vector
                ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)0x34b28b);
      local_164 = local_14;
      while (local_164 = local_164 - 1, -1 < (int)local_164) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        local_178 = rVar13;
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_178);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          ppNVar10 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                               (*(vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> **)
                                 ((in_RDI->d).d + 2),(long)(int)local_164);
          local_180 = *ppNVar10;
          Node::arity((Node *)0x34b3a1);
          std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                    ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                     in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          local_184 = 0;
          local_190 = &local_180->args;
          local_198._M_current =
               (VariableIndex *)
               std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                         ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                          in_stack_fffffffffffffc48);
          local_1a0 = (VariableIndex *)
                      std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                                ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                                 in_stack_fffffffffffffc48);
          while( true ) {
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                                *)in_stack_fffffffffffffc50,
                               (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                                *)in_stack_fffffffffffffc48);
            if (!bVar3) break;
            pVVar12 = __gnu_cxx::
                      __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                      ::operator*(&local_198);
            VariableIndex::VariableIndex(&local_1a4,pVVar12);
            VariableIndex::operator_cast_to_unsigned_int_(&local_1a4);
            rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
            local_1b8 = rVar13;
            std::_Bit_reference::operator=(&local_1b8,true);
            pDVar1 = &in_RDI->d;
            puVar5 = VariableIndex::operator_cast_to_unsigned_int_(&local_1a4);
            pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                               ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(pDVar1->d + 4)
                                ,(ulong)*puVar5);
            ppTVar11 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::
                       operator[](&local_160,(ulong)local_184);
            *ppTVar11 = pvVar8;
            local_184 = local_184 + 1;
            __gnu_cxx::
            __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
            ::operator++(&local_198);
          }
          local_184 = 0;
          local_1c0 = &local_180->args;
          local_1c8._M_current =
               (VariableIndex *)
               std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                         ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                          in_stack_fffffffffffffc48);
          local_1d0 = (VariableIndex *)
                      std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                                ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                                 in_stack_fffffffffffffc48);
          while( true ) {
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                                *)in_stack_fffffffffffffc50,
                               (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                                *)in_stack_fffffffffffffc48);
            if (!bVar3) break;
            pVVar12 = __gnu_cxx::
                      __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                      ::operator*(&local_1c8);
            VariableIndex::VariableIndex(&local_1d4,pVVar12);
            VariableIndex::operator_cast_to_unsigned_int_(&local_1d4);
            rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
            local_1e8 = rVar13;
            bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_1e8);
            if (bVar3) {
              std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                        ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)((in_RDI->d).d + 4),
                         (long)(int)local_164);
              this_00 = &in_RDI->v;
              std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                        ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)this_00,
                         (long)(int)local_164);
              puVar5 = VariableIndex::operator_cast_to_unsigned_int_(&local_1d4);
              std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                        ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)this_00,(ulong)*puVar5
                        );
              Node::backward(in_stack_fffffffffffffe10,
                             (vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                             in_stack_fffffffffffffe08._M_current,in_stack_fffffffffffffe00,
                             in_stack_fffffffffffffdf8,(uint)(uVar6 >> 0x20),in_RDI);
            }
            local_184 = local_184 + 1;
            __gnu_cxx::
            __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
            ::operator++(&local_1c8);
          }
        }
      }
      std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::begin
                ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                 in_stack_fffffffffffffc48);
      std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::end
                ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)
                 in_stack_fffffffffffffc48);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                            *)in_stack_fffffffffffffc50,
                           (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                            *)in_stack_fffffffffffffc48);
        if (!bVar3) break;
        pVVar12 = __gnu_cxx::
                  __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                  ::operator*((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                               *)&stack0xfffffffffffffe08);
        in_stack_fffffffffffffc60 = (AlignedMemoryPool<6U> *)&stack0xfffffffffffffdfc;
        VariableIndex::VariableIndex((VariableIndex *)in_stack_fffffffffffffc60,pVVar12);
        this_01 = *(vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> **)((in_RDI->d).d + 2);
        puVar5 = VariableIndex::operator_cast_to_unsigned_int_
                           ((VariableIndex *)in_stack_fffffffffffffc60);
        ppNVar10 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::operator[]
                             (this_01,(ulong)*puVar5);
        in_stack_fffffffffffffc48 = *ppNVar10;
        in_stack_fffffffffffffc50 = (Dim *)&in_RDI->v;
        puVar5 = VariableIndex::operator_cast_to_unsigned_int_
                           ((VariableIndex *)&stack0xfffffffffffffdfc);
        pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                           ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                            in_stack_fffffffffffffc50,(ulong)*puVar5);
        (*in_stack_fffffffffffffc48->_vptr_Node[10])(in_stack_fffffffffffffc48,pvVar8);
        __gnu_cxx::
        __normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
        ::operator++((__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
                      *)&stack0xfffffffffffffe08);
      }
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::~vector
                ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                 in_stack_fffffffffffffc60);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x34b85c);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x34b869);
      return;
    }
    pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)((in_RDI->d).d + 4),
                        (ulong)local_18);
    memcpy(local_3c,pvVar8,0x24);
    pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)&in_RDI->v,
                        (ulong)local_18);
    memcpy(pvVar8,local_3c,0x24);
    Dim::size(in_stack_fffffffffffffc50);
    pfVar9 = (float *)AlignedMemoryPool<6U>::allocate
                                (in_stack_fffffffffffffc60,(size_t)in_stack_fffffffffffffc58);
    pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)&in_RDI->v,
                        (ulong)local_18);
    pvVar8->v = pfVar9;
    pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)&in_RDI->v,
                        (ulong)local_18);
    if (pvVar8->v == (float *)0x0) break;
    local_18 = local_18 + 1;
  }
  __assert_fail("ndEdfs[i].v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                ,100,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
}

Assistant:

void SimpleExecutionEngine::backward(VariableIndex from_where) {
  assert(from_where+1 <= nfxs.size());
  assert(from_where+1 <= cg.nodes.size());
  if (nfxs[from_where].d.size() != 1) {
    cerr << "backward() called on non-scalar node.\n";
    abort();
  }

  const unsigned num_nodes = from_where+1;
  ndEdfs.resize(num_nodes);
  dEdfs->free();
  for (unsigned i = 0; i < num_nodes; ++i) {
    const auto dim = nfxs[i].d;
    ndEdfs[i].d = dim;
    ndEdfs[i].v = static_cast<float*>(dEdfs->allocate(dim.size() * sizeof(float)));
    assert(ndEdfs[i].v);
  }
  dEdfs->zero_allocated_memory();
  // initialize dE/dE = 1
  ndEdfs.back().v = kSCALAR_ONE;

  // here we find constant paths to avoid doing extra work
  // by default, a node is constant unless
  //   1) it is a parameter node
  //   2) it depends on a non-constant node
  // (thus, functions of constants and inputs end up being
  //  false in this computation)
  vector<bool> needs_derivative(num_nodes, false);
  for (auto i : cg.parameter_nodes)
    needs_derivative[i] = true;

  for (unsigned ni = 0; ni < num_nodes; ++ni) {
    bool nd = needs_derivative[ni];
    for (auto arg : cg.nodes[ni]->args)
      nd |= needs_derivative[arg];
    needs_derivative[ni] = nd;
  }

  // loop in reverse topological order
  // consider only nodes that participate in the computation.
  vector<bool> in_computation(num_nodes, false);
  in_computation[num_nodes - 1] = true;
  vector<const Tensor*> xs;
  for (int i = num_nodes - 1; i >= 0; --i) {
    if (!in_computation[i]) continue;
    const Node* node = cg.nodes[i];
    xs.resize(node->arity());
    unsigned ai = 0;
    for (VariableIndex arg : node->args) {
      in_computation[arg] = true;
      xs[ai] = &nfxs[arg];
      ++ai;
    }
    ai = 0;
    for (VariableIndex arg : node->args) {
      if (needs_derivative[arg]) {
        node->backward(xs, nfxs[i], ndEdfs[i], ai, ndEdfs[arg]);
      }
      ++ai;
    }
  }

  // accumulate gradients into parameters
  // this is simpler than you might find in some other frameworks
  // since we assume parameters come into the graph as a "function"
  // that returns the current value of the parameters
  for (VariableIndex i : cg.parameter_nodes)
    static_cast<ParameterNodeBase*>(cg.nodes[i])->accumulate_grad(ndEdfs[i]);
}